

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<int>(uint length,int value)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  uint i;
  int iVar6;
  long lVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  undefined8 *puVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  int iVar13;
  uint uVar14;
  size_t __size;
  uint uVar15;
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  shared_ptr<int> pa;
  undefined1 (*local_50) [16];
  shared_ptr<int> pb;
  
  __size = (long)(int)(length + 1) << 2;
  iVar6 = posix_memalign(&local_50,0x40,__size);
  local_68 = (undefined1 (*) [16])0x0;
  if (iVar6 == 0) {
    local_68 = local_50;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_68,sse::common::free<int>);
  iVar6 = posix_memalign(&local_70,0x40,__size);
  local_50 = (undefined1 (*) [16])0x0;
  if (iVar6 == 0) {
    local_50 = local_70;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,local_50,sse::common::free<int>);
  pauVar5 = local_50;
  pauVar4 = local_68;
  uVar3 = (ulong)length;
  *(undefined4 *)(*local_68 + uVar3 * 4) = 0x7f;
  *(undefined4 *)(*local_50 + uVar3 * 4) = 0x3f;
  iVar13 = (int)length >> 2;
  pauVar9 = local_68;
  iVar12 = iVar13;
  iVar6 = iVar13;
  if (3 < iVar13) {
    do {
      *(int *)*pauVar9 = value;
      *(int *)(*pauVar9 + 4) = value;
      *(int *)(*pauVar9 + 8) = value;
      *(int *)(*pauVar9 + 0xc) = value;
      *(int *)pauVar9[1] = value;
      *(int *)(pauVar9[1] + 4) = value;
      *(int *)(pauVar9[1] + 8) = value;
      *(int *)(pauVar9[1] + 0xc) = value;
      *(int *)pauVar9[2] = value;
      *(int *)(pauVar9[2] + 4) = value;
      *(int *)(pauVar9[2] + 8) = value;
      *(int *)(pauVar9[2] + 0xc) = value;
      *(int *)pauVar9[3] = value;
      *(int *)(pauVar9[3] + 4) = value;
      *(int *)(pauVar9[3] + 8) = value;
      *(int *)(pauVar9[3] + 0xc) = value;
      iVar6 = iVar12 + -4;
      pauVar9 = pauVar9 + 4;
      bVar1 = 7 < iVar12;
      iVar12 = iVar6;
    } while (bVar1);
  }
  if (1 < iVar6) {
    *(int *)*pauVar9 = value;
    *(int *)(*pauVar9 + 4) = value;
    *(int *)(*pauVar9 + 8) = value;
    *(int *)(*pauVar9 + 0xc) = value;
    *(int *)pauVar9[1] = value;
    *(int *)(pauVar9[1] + 4) = value;
    *(int *)(pauVar9[1] + 8) = value;
    *(int *)(pauVar9[1] + 0xc) = value;
    iVar6 = iVar6 + -2;
    pauVar9 = pauVar9 + 2;
  }
  if (iVar6 != 0) {
    *(int *)*pauVar9 = value;
    *(int *)(*pauVar9 + 4) = value;
    *(int *)(*pauVar9 + 8) = value;
    *(int *)(*pauVar9 + 0xc) = value;
  }
  uVar14 = length & 0xfffffffc;
  if (uVar14 != length) {
    lVar7 = (long)(int)uVar14;
    do {
      *(int *)(*local_68 + lVar7 * 4) = value;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)length);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(int *)(*local_68 + lVar7 * 4) != value) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar10 + 1) = 0x16;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  pauVar9 = local_50;
  pauVar11 = local_68;
  iVar6 = iVar13;
  iVar12 = iVar13;
  if (3 < iVar13) {
    do {
      uVar2 = *(undefined8 *)(*pauVar11 + 8);
      *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar11;
      *(undefined8 *)(*pauVar9 + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[1] + 8);
      *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar11[1];
      *(undefined8 *)(pauVar9[1] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[2] + 8);
      *(undefined8 *)pauVar9[2] = *(undefined8 *)pauVar11[2];
      *(undefined8 *)(pauVar9[2] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[3] + 8);
      *(undefined8 *)pauVar9[3] = *(undefined8 *)pauVar11[3];
      *(undefined8 *)(pauVar9[3] + 8) = uVar2;
      iVar6 = iVar12 + -4;
      pauVar11 = pauVar11 + 4;
      pauVar9 = pauVar9 + 4;
      bVar1 = 7 < iVar12;
      iVar12 = iVar6;
    } while (bVar1);
  }
  if (1 < iVar6) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar9 + 8) = uVar2;
    uVar2 = *(undefined8 *)(pauVar11[1] + 8);
    *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar11[1];
    *(undefined8 *)(pauVar9[1] + 8) = uVar2;
    iVar6 = iVar6 + -2;
    pauVar11 = pauVar11 + 2;
    pauVar9 = pauVar9 + 2;
  }
  if (iVar6 != 0) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar9 + 8) = uVar2;
  }
  if (uVar14 != length) {
    lVar7 = (long)(int)uVar14;
    do {
      *(undefined4 *)(*local_50 + lVar7 * 4) = *(undefined4 *)(*local_68 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)length);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(int *)(*local_50 + lVar7 * 4) != value) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar10 + 1) = 0x1d;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  pauVar9 = local_50;
  iVar6 = iVar13;
  if (3 < iVar13) {
    iVar6 = 7;
    if (iVar13 < 7) {
      iVar6 = iVar13;
    }
    uVar15 = (iVar13 - iVar6) + 3;
    pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(uVar15 >> 2) * 0x40);
    pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = uVar14;
    memset(local_50,0,
           (size_t)(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4));
    iVar6 = (iVar13 - (uVar15 & 0xfffffffc)) + -4;
    pauVar9 = (undefined1 (*) [16])
              (pauVar5[4] +
              (long)&(pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base);
    uVar14 = pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
  }
  if (1 < iVar6) {
    iVar6 = iVar6 + -2;
    pauVar9[1] = (undefined1  [16])0x0;
    *pauVar9 = (undefined1  [16])0x0;
    pauVar9 = pauVar9 + 2;
  }
  if (iVar6 != 0) {
    *pauVar9 = (undefined1  [16])0x0;
  }
  if (uVar14 != length) {
    uVar15 = uVar14 | 1;
    if ((int)(uVar14 | 1) < (int)length) {
      uVar15 = length;
    }
    memset(*pauVar5 + (long)(int)uVar14 * 4,0,(ulong)(~uVar14 + uVar15) * 4 + 4);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(int *)(*pauVar5 + lVar7 * 4) != 0) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar10 + 1) = 0x24;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
    uVar8 = 0;
    do {
      *(int *)(*pauVar4 + uVar8 * 4) = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  pauVar9 = pauVar5;
  pauVar11 = pauVar4;
  iVar6 = iVar13;
  if (3 < iVar13) {
    do {
      uVar2 = *(undefined8 *)(*pauVar11 + 8);
      *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar11;
      *(undefined8 *)(*pauVar9 + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[1] + 8);
      *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar11[1];
      *(undefined8 *)(pauVar9[1] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[2] + 8);
      *(undefined8 *)pauVar9[2] = *(undefined8 *)pauVar11[2];
      *(undefined8 *)(pauVar9[2] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[3] + 8);
      *(undefined8 *)pauVar9[3] = *(undefined8 *)pauVar11[3];
      *(undefined8 *)(pauVar9[3] + 8) = uVar2;
      iVar6 = iVar13 + -4;
      pauVar11 = pauVar11 + 4;
      pauVar9 = pauVar9 + 4;
      bVar1 = 7 < iVar13;
      iVar13 = iVar6;
    } while (bVar1);
  }
  if (1 < iVar6) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar9 + 8) = uVar2;
    uVar2 = *(undefined8 *)(pauVar11[1] + 8);
    *(undefined8 *)pauVar9[1] = *(undefined8 *)pauVar11[1];
    *(undefined8 *)(pauVar9[1] + 8) = uVar2;
    iVar6 = iVar6 + -2;
    pauVar11 = pauVar11 + 2;
    pauVar9 = pauVar9 + 2;
  }
  if (iVar6 != 0) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar9 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar9 + 8) = uVar2;
  }
  if (uVar14 != length) {
    lVar7 = (long)(int)uVar14;
    do {
      *(undefined4 *)(*pauVar5 + lVar7 * 4) = *(undefined4 *)(*pauVar4 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)length);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if ((int)lVar7 != *(int *)(*pauVar5 + lVar7 * 4)) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar10 = "void test_common(unsigned int, T) [T = int]";
        *(undefined4 *)(puVar10 + 1) = 0x2d;
        *(uint *)((long)puVar10 + 0xc) = length;
        __cxa_throw(puVar10,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if ((*(int *)(*pauVar4 + uVar3 * 4) == 0x7f) && (*(int *)(*pauVar5 + uVar3 * 4) == 0x3f)) {
    if (pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar10 = "void test_common(unsigned int, T) [T = int]";
  *(undefined4 *)(puVar10 + 1) = 0x31;
  *(uint *)((long)puVar10 + 0xc) = length;
  __cxa_throw(puVar10,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}